

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# krunxx.cpp
# Opt level: O2

void run_acquisition(device *dev,config *c)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  size_t __nbytes;
  int __fd;
  double dVar4;
  undefined1 auVar5 [16];
  code *local_1a8 [2];
  code *local_198;
  code *local_190;
  acquisition<katherine::acq::f_toa_tot> acq;
  
  __nbytes = 0x180000;
  katherine::acquisition<katherine::acq::f_toa_tot>::
  acquisition<long,std::ratio<1l,1000l>,long,std::ratio<1l,1l>>
            (&acq,dev,0xc7ffffe,0x180000,(duration<long,_std::ratio<1L,_1000L>_>)0x1f4,
             (duration<long,_std::ratio<1L,_1L>_>)0xa,true);
  local_1a8[1] = (code *)0x0;
  local_1a8[0] = frame_started;
  local_190 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_invoke;
  local_198 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_manager;
  std::function<void_(int)>::operator=
            (&acq.super_base_acquisition.frame_started_handler_,(function<void_(int)> *)local_1a8);
  std::_Function_base::~_Function_base((_Function_base *)local_1a8);
  local_1a8[1] = (code *)0x0;
  local_1a8[0] = frame_ended;
  local_190 = std::
              _Function_handler<void_(int,_bool,_const_katherine_frame_info_&),_void_(*)(int,_bool,_const_katherine_frame_info_&)>
              ::_M_invoke;
  local_198 = std::
              _Function_handler<void_(int,_bool,_const_katherine_frame_info_&),_void_(*)(int,_bool,_const_katherine_frame_info_&)>
              ::_M_manager;
  std::function<void_(int,_bool,_const_katherine_frame_info_&)>::operator=
            (&acq.super_base_acquisition.frame_ended_handler_,
             (function<void_(int,_bool,_const_katherine_frame_info_&)> *)local_1a8);
  std::_Function_base::~_Function_base((_Function_base *)local_1a8);
  local_1a8[1] = (code *)0x0;
  local_1a8[0] = pixels_received;
  local_190 = std::
              _Function_handler<void_(const_katherine_px_f_toa_tot_*,_unsigned_long),_void_(*)(const_katherine_px_f_toa_tot_*,_unsigned_long)>
              ::_M_invoke;
  local_198 = std::
              _Function_handler<void_(const_katherine_px_f_toa_tot_*,_unsigned_long),_void_(*)(const_katherine_px_f_toa_tot_*,_unsigned_long)>
              ::_M_manager;
  std::function<void_(const_katherine_px_f_toa_tot_*,_unsigned_long)>::operator=
            (&acq.pixels_received_handler_,
             (function<void_(const_katherine_px_f_toa_tot_*,_unsigned_long)> *)local_1a8);
  std::_Function_base::~_Function_base((_Function_base *)local_1a8);
  katherine::base_acquisition::begin(&acq.super_base_acquisition,c,data_driven);
  __fd = 0x10414c;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Acquisition started.");
  std::endl<char,std::char_traits<char>>(poVar1);
  auVar5 = std::chrono::_V2::steady_clock::now();
  katherine::base_acquisition::read(&acq.super_base_acquisition,__fd,auVar5._8_8_,__nbytes);
  lVar2 = std::chrono::_V2::steady_clock::now();
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Acquisition completed:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1," - state: ");
  pcVar3 = (char *)katherine_str_acquisition_status((int)acq.super_base_acquisition.acq_.state);
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1," - received ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,acq.super_base_acquisition.acq_.completed_frames);
  poVar1 = std::operator<<(poVar1," complete frames");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1," - dropped ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," measurement data items");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1," - total hits: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1," - total duration: ");
  dVar4 = (double)((lVar2 - auVar5._0_8_) / 1000000) / 1000.0;
  poVar1 = std::ostream::_M_insert<double>(dVar4);
  poVar1 = std::operator<<(poVar1," s");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1," - throughput: ");
  poVar1 = std::ostream::_M_insert<double>
                     ((((double)CONCAT44(0x45300000,(int)(n_hits >> 0x20)) - 1.9342813113834067e+25)
                      + ((double)CONCAT44(0x43300000,(int)n_hits) - 4503599627370496.0)) / dVar4);
  poVar1 = std::operator<<(poVar1," hits/s");
  std::endl<char,std::char_traits<char>>(poVar1);
  katherine::acquisition<katherine::acq::f_toa_tot>::~acquisition(&acq);
  return;
}

Assistant:

void
run_acquisition(katherine::device& dev, const katherine::config& c)
{
    using namespace std::chrono;
    using namespace std::literals::chrono_literals;

    katherine::acquisition<mode> acq{dev, katherine::md_size * 34952533, sizeof(mode::pixel_type) * 65536, 500ms, 10s, true};

    acq.set_frame_started_handler(frame_started);
    acq.set_frame_ended_handler(frame_ended);
    acq.set_pixels_received_handler(pixels_received);

    acq.begin(c, katherine::readout_type::data_driven);
    std::cerr << "Acquisition started." << std::endl;

    auto tic = steady_clock::now();
    acq.read();
    auto toc = steady_clock::now();

    double duration = duration_cast<milliseconds>(toc - tic).count() / 1000.;
    std::cerr << std::endl;
    std::cerr << "Acquisition completed:" << std::endl
                << " - state: " << katherine::str_acq_state(acq.state()) << std::endl
                << " - received " << acq.completed_frames() << " complete frames" << std::endl
                << " - dropped " << acq.dropped_measurement_data() << " measurement data items" << std::endl
                << " - total hits: " << n_hits << std::endl
                << " - total duration: " << duration << " s" << std::endl
                << " - throughput: " << (n_hits / duration) << " hits/s" << std::endl;
}